

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::ParseFormatPrecision(char *fmt,int default_precision)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  
  while( true ) {
    pcVar3 = strchr(fmt,0x25);
    if (pcVar3 == (char *)0x0) {
      return default_precision;
    }
    if (pcVar3[1] != '%') break;
    fmt = pcVar3 + 2;
  }
  pcVar3 = pcVar3 + 1;
  do {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while ((byte)(cVar1 - 0x30U) < 10);
  if ((cVar1 == '.') && (uVar2 = atoi(pcVar3), uVar2 < 0xb)) {
    default_precision = uVar2;
  }
  return default_precision;
}

Assistant:

int ImGui::ParseFormatPrecision(const char* fmt, int default_precision)
{
    int precision = default_precision;
    while ((fmt = strchr(fmt, '%')) != NULL)
    {
        fmt++;
        if (fmt[0] == '%') { fmt++; continue; } // Ignore "%%"
        while (*fmt >= '0' && *fmt <= '9')
            fmt++;
        if (*fmt == '.')
        {
            precision = atoi(fmt + 1);
            if (precision < 0 || precision > 10)
                precision = default_precision;
        }
        break;
    }
    return precision;
}